

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_3fVector * __thiscall ON_3fVector::operator=(ON_3fVector *this,float *v)

{
  if (v != (float *)0x0) {
    this->x = *v;
    this->y = v[1];
    this->z = v[2];
    return this;
  }
  this->z = 0.0;
  this->x = 0.0;
  this->y = 0.0;
  return this;
}

Assistant:

ON_3fVector& ON_3fVector::operator=(const float* v)
{
  if ( v ) {
    x = v[0];
    y = v[1];
    z = v[2];
  }
  else {
    x = y = z = 0.0;
  }
  return *this;
}